

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  long lVar2;
  XmlOutput *pXVar3;
  QLatin1String *pQVar4;
  triState tVar5;
  undefined4 in_register_00000034;
  char *pcVar6;
  int i;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_11f8;
  xml_output local_11e0;
  xml_output local_11a8;
  xml_output local_1170;
  QArrayDataPointer<char16_t> local_1138;
  xml_output local_1120;
  xml_output local_10e8;
  xml_output local_10b0;
  xml_output local_1078;
  xml_output local_1040;
  xml_output local_1008;
  xml_output local_fd0;
  xml_output local_f98;
  xml_output local_f60;
  QArrayDataPointer<char16_t> local_f28;
  xml_output local_f10;
  xml_output local_ed8;
  xml_output local_ea0;
  xml_output local_e68;
  xml_output local_e30;
  QArrayDataPointer<char16_t> local_df8;
  xml_output local_dd8;
  xml_output local_da0;
  xml_output local_d68;
  xml_output local_d30;
  xml_output local_cf8;
  xml_output local_cc0;
  QArrayDataPointer<QString> local_c88;
  xml_output local_c68;
  xml_output local_c30;
  xml_output local_bf8;
  xml_output local_bc0;
  QArrayDataPointer<char16_t> local_b88;
  xml_output local_b70;
  QArrayDataPointer<char16_t> local_b38;
  xml_output local_b18;
  xml_output local_ae0;
  xml_output local_aa8;
  xml_output local_a70;
  xml_output local_a38;
  xml_output local_a00;
  xml_output local_9c8;
  xml_output local_990;
  xml_output local_958;
  xml_output local_920;
  QArrayDataPointer<char16_t> local_8e8;
  xml_output local_8d0;
  xml_output local_898;
  xml_output local_860;
  xml_output local_828;
  xml_output local_7f0;
  xml_output local_7b8;
  xml_output local_780;
  QArrayDataPointer<char16_t> local_748;
  xml_output local_728;
  xml_output local_6f0;
  QArrayDataPointer<char16_t> local_6b8;
  xml_output local_698;
  xml_output local_660;
  QArrayDataPointer<char16_t> local_628;
  xml_output local_608;
  xml_output local_5d0;
  xml_output local_598;
  xml_output local_560;
  QArrayDataPointer<char16_t> local_528;
  xml_output local_510;
  xml_output local_4d8;
  xml_output local_4a0;
  QArrayDataPointer<char16_t> local_468;
  xml_output local_450;
  xml_output local_418;
  xml_output local_3e0;
  QArrayDataPointer<char16_t> local_3a8;
  xml_output local_390;
  QArrayDataPointer<char16_t> local_358;
  xml_output local_340;
  QArrayDataPointer<char16_t> local_308;
  xml_output local_2e8;
  xml_output local_2b0;
  xml_output local_278;
  xml_output local_240;
  QArrayDataPointer<char16_t> local_208;
  xml_output local_1f0;
  QArrayDataPointer<char16_t> local_1b8;
  xml_output local_1a0;
  xml_output local_168;
  xml_output local_130;
  xml_output local_f8;
  xml_output local_c0;
  QArrayDataPointer<char16_t> local_88;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_88,"ClCompile");
  tag(&local_70,(QString *)&local_88);
  pXVar3 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  attrTagX(&local_c0,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_c0);
  attrTagX(&local_f8,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_f8);
  attrTagX(&local_130,"AdditionalUsingDirectories",(QStringList *)((long)__buf + 0x38),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_130);
  attrTagS(&local_168,"AssemblerListingLocation",(QString *)((long)__buf + 0x50));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_168);
  switch(*(undefined4 *)((long)__buf + 0x68)) {
  case 1:
    pcVar6 = "AssemblyCode";
    break;
  case 2:
    pcVar6 = "All";
    break;
  case 3:
    pcVar6 = "AssemblyAndMachineCode";
    break;
  case 4:
    pcVar6 = "AssemblyAndSourceCode";
    break;
  default:
    local_1b8.d = (Data *)0x0;
    local_1b8.ptr = (char16_t *)0x0;
    local_1b8.size = 0;
    goto LAB_001a4068;
  }
  QString::QString((QString *)&local_1b8,pcVar6);
LAB_001a4068:
  attrTagS(&local_1a0,"AssemblerOutput",(QString *)&local_1b8);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1a0);
  switch(*(undefined4 *)((long)__buf + 0x6c)) {
  case 0:
    pcVar6 = "";
    break;
  case 1:
    pcVar6 = "StackFrameRuntimeCheck";
    break;
  case 2:
    pcVar6 = "UninitializedLocalUsageCheck";
    break;
  case 3:
    pcVar6 = "EnableFastChecks";
    break;
  default:
    local_208.d = (Data *)0x0;
    local_208.ptr = (char16_t *)0x0;
    local_208.size = 0;
    goto LAB_001a40e2;
  }
  QString::QString((QString *)&local_208,pcVar6);
LAB_001a40e2:
  attrTagS(&local_1f0,"BasicRuntimeChecks",(QString *)&local_208);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1f0);
  if ((ulong)*(uint *)((long)__buf + 0x70) < 3) {
    tVar5 = *(triState *)(&DAT_0021fbb0 + (ulong)*(uint *)((long)__buf + 0x70) * 4);
  }
  else {
    tVar5 = unset;
  }
  attrTagT(&local_240,"BrowseInformation",tVar5);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_240);
  attrTagS(&local_278,"BrowseInformationFile",(QString *)((long)__buf + 0x78));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_278);
  attrTagT(&local_2b0,"BufferSecurityCheck",*(triState *)((long)__buf + 0x90));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_2b0);
  iVar1 = *(int *)((long)__buf + 0x94);
  if (iVar1 == 2) {
    pcVar6 = "StdCall";
LAB_001a41cd:
    QString::QString((QString *)&local_308,pcVar6);
  }
  else {
    if (iVar1 == 1) {
      pcVar6 = "FastCall";
      goto LAB_001a41cd;
    }
    if (iVar1 == 0) {
      pcVar6 = "Cdecl";
      goto LAB_001a41cd;
    }
    local_308.d = (Data *)0x0;
    local_308.ptr = (char16_t *)0x0;
    local_308.size = 0;
  }
  attrTagS(&local_2e8,"CallingConvention",(QString *)&local_308);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_2e8);
  if (*(int *)((long)__buf + 0x98) == 2) {
    pcVar6 = "CompileAsCpp";
LAB_001a423d:
    QString::QString((QString *)&local_358,pcVar6);
  }
  else {
    if (*(int *)((long)__buf + 0x98) == 1) {
      pcVar6 = "CompileAsC";
      goto LAB_001a423d;
    }
    local_358.d = (Data *)0x0;
    local_358.ptr = (char16_t *)0x0;
    local_358.size = 0;
  }
  attrTagS(&local_340,"CompileAs",(QString *)&local_358);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_340);
  iVar1 = *(int *)((long)__buf + 0x9c);
  if (iVar1 == 4) {
    pcVar6 = "OldSyntax";
LAB_001a42bb:
    QString::QString((QString *)&local_3a8,pcVar6);
  }
  else {
    if (iVar1 == 2) {
      pcVar6 = "Safe";
      goto LAB_001a42bb;
    }
    if (iVar1 == 1) {
      pcVar6 = "true";
      goto LAB_001a42bb;
    }
    local_3a8.d = (Data *)0x0;
    local_3a8.ptr = (char16_t *)0x0;
    local_3a8.size = 0;
  }
  attrTagS(&local_390,"CompileAsManaged",(QString *)&local_3a8);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_390);
  attrTagT(&local_3e0,"CompileAsWinRT",*(triState *)((long)__buf + 0xa0));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_3e0);
  attrTagT(&local_418,"CreateHotpatchableImage",*(triState *)((long)__buf + 0x2f8));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_418);
  switch(*(undefined4 *)((long)__buf + 0xa8)) {
  case 0:
    if (0xa0 < *(int *)(*(long *)((long)__buf + 0x318) + 4)) {
      pcVar6 = "None";
      break;
    }
  default:
    local_468.d = (Data *)0x0;
    local_468.ptr = (char16_t *)0x0;
    local_468.size = 0;
    goto LAB_001a4405;
  case 1:
    pcVar6 = "OldStyle";
    break;
  case 3:
    pcVar6 = "ProgramDatabase";
    break;
  case 4:
    pcVar6 = "EditAndContinue";
  }
  QString::QString((QString *)&local_468,pcVar6);
LAB_001a4405:
  attrTagS(&local_450,"DebugInformationFormat",(QString *)&local_468);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_450);
  attrTagT(&local_4a0,"DisableLanguageExtensions",*(triState *)((long)__buf + 0xb4));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_4a0);
  attrTagX(&local_4d8,"DisableSpecificWarnings",(QStringList *)((long)__buf + 0xb8),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_4d8);
  if (*(int *)((long)__buf + 0xd0) == 2) {
    pcVar6 = "StreamingSIMDExtensions2";
LAB_001a44b0:
    QString::QString((QString *)&local_528,pcVar6);
  }
  else {
    if (*(int *)((long)__buf + 0xd0) == 1) {
      pcVar6 = "StreamingSIMDExtensions";
      goto LAB_001a44b0;
    }
    local_528.d = (Data *)0x0;
    local_528.ptr = (char16_t *)0x0;
    local_528.size = 0;
  }
  attrTagS(&local_510,"EnableEnhancedInstructionSet",(QString *)&local_528);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_510);
  attrTagT(&local_560,"EnableFiberSafeOptimizations",*(triState *)((long)__buf + 0xd4));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_560);
  attrTagT(&local_598,"EnablePREfast",*(triState *)((long)__buf + 0x29c));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_598);
  attrTagS(&local_5d0,"ErrorReporting",(QString *)((long)__buf + 0x2e0));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_5d0);
  iVar1 = *(int *)((long)__buf + 0xe0);
  if (iVar1 == 2) {
    pcVar6 = "Async";
LAB_001a45af:
    QString::QString((QString *)&local_628,pcVar6);
  }
  else {
    if (iVar1 == 1) {
      pcVar6 = "Sync";
      goto LAB_001a45af;
    }
    if (iVar1 == 0) {
      pcVar6 = "false";
      goto LAB_001a45af;
    }
    local_628.d = (Data *)0x0;
    local_628.ptr = (char16_t *)0x0;
    local_628.size = 0;
  }
  attrTagS(&local_608,"ExceptionHandling",(QString *)&local_628);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_608);
  attrTagT(&local_660,"ExpandAttributedSource",*(triState *)((long)__buf + 0xe4));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_660);
  if (*(int *)((long)__buf + 0xe8) == 1) {
    pcVar6 = "Speed";
LAB_001a464a:
    QString::QString((QString *)&local_6b8,pcVar6);
  }
  else {
    if (*(int *)((long)__buf + 0xe8) == 2) {
      pcVar6 = "Size";
      goto LAB_001a464a;
    }
    local_6b8.d = (Data *)0x0;
    local_6b8.ptr = (char16_t *)0x0;
    local_6b8.size = 0;
  }
  attrTagS(&local_698,"FavorSizeOrSpeed",(QString *)&local_6b8);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_698);
  attrTagT(&local_6f0,"FloatingPointExceptions",*(triState *)((long)__buf + 0xf0));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_6f0);
  iVar1 = *(int *)((long)__buf + 0xec);
  if (iVar1 == 0) {
    pcVar6 = "Precise";
LAB_001a46f2:
    QString::QString((QString *)&local_748,pcVar6);
  }
  else {
    if (iVar1 == 1) {
      pcVar6 = "Strict";
      goto LAB_001a46f2;
    }
    if (iVar1 == 2) {
      pcVar6 = "Fast";
      goto LAB_001a46f2;
    }
    local_748.d = (Data *)0x0;
    local_748.ptr = (char16_t *)0x0;
    local_748.size = 0;
  }
  attrTagS(&local_728,"FloatingPointModel",(QString *)&local_748);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_728);
  attrTagT(&local_780,"ForceConformanceInForLoopScope",*(triState *)((long)__buf + 0xf4));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_780);
  attrTagX(&local_7b8,"ForcedIncludeFiles",(QStringList *)((long)__buf + 0xf8),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_7b8);
  attrTagX(&local_7f0,"ForcedUsingFiles",(QStringList *)((long)__buf + 0x110),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_7f0);
  attrTagT(&local_828,"FunctionLevelLinking",*(triState *)((long)__buf + 0xd8));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_828);
  attrTagT(&local_860,"GenerateXMLDocumentationFiles",*(triState *)((long)__buf + 0x2c0));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_860);
  attrTagT(&local_898,"IgnoreStandardIncludePath",*(triState *)((long)__buf + 0x134));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_898);
  iVar1 = *(int *)((long)__buf + 0x13c);
  if (iVar1 == 2) {
    pcVar6 = "AnySuitable";
LAB_001a4880:
    QString::QString((QString *)&local_8e8,pcVar6);
  }
  else {
    if (iVar1 == 1) {
      pcVar6 = "OnlyExplicitInline";
      goto LAB_001a4880;
    }
    if (iVar1 == 0) {
      pcVar6 = "Disabled";
      goto LAB_001a4880;
    }
    local_8e8.d = (Data *)0x0;
    local_8e8.ptr = (char16_t *)0x0;
    local_8e8.size = 0;
  }
  attrTagS(&local_8d0,"InlineFunctionExpansion",(QString *)&local_8e8);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_8d0);
  attrTagT(&local_920,"IntrinsicFunctions",*(triState *)((long)__buf + 0xdc));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_920);
  attrTagT(&local_958,"MinimalRebuild",*(triState *)((long)__buf + 0x178));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_958);
  attrTagT(&local_990,"MultiProcessorCompilation",*(triState *)((long)__buf + 0x2a4));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_990);
  attrTagS(&local_9c8,"LanguageStandard",(QString *)((long)__buf + 0x148));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_9c8);
  attrTagS(&local_a00,"LanguageStandard_C",(QString *)((long)__buf + 0x160));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_a00);
  attrTagS(&local_a38,"ObjectFileName",(QString *)((long)__buf + 0x180));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_a38);
  attrTagT(&local_a70,"OmitDefaultLibName",*(triState *)((long)__buf + 0x198));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_a70);
  attrTagT(&local_aa8,"OmitFramePointers",*(triState *)((long)__buf + 0x19c));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_aa8);
  attrTagT(&local_ae0,"OpenMPSupport",*(triState *)((long)__buf + 0x1a0));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_ae0);
  switch(*(undefined4 *)((long)__buf + 0x1a4)) {
  case 0:
    pcVar6 = "Disabled";
    break;
  case 1:
    pcVar6 = "MinSpace";
    break;
  case 2:
    pcVar6 = "MaxSpeed";
    break;
  case 3:
    pcVar6 = "Full";
    break;
  default:
    local_b38.d = (Data *)0x0;
    local_b38.ptr = (char16_t *)0x0;
    local_b38.size = 0;
    goto LAB_001a4aa6;
  }
  QString::QString((QString *)&local_b38,pcVar6);
LAB_001a4aa6:
  attrTagS(&local_b18,"Optimization",(QString *)&local_b38);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_b18);
  toString((QString *)&local_b88,*(pchOption *)((long)__buf + 0x268));
  attrTagS(&local_b70,"PrecompiledHeader",(QString *)&local_b88);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_b70);
  attrTagS(&local_bc0,"PrecompiledHeaderFile",(QString *)((long)__buf + 0x1e0));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_bc0);
  attrTagS(&local_bf8,"PrecompiledHeaderOutputFile",(QString *)((long)__buf + 0x1c8));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_bf8);
  attrTagT(&local_c30,"PreprocessKeepComments",*(triState *)((long)__buf + 0x140));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_c30);
  local_c88.d = (Data *)0x0;
  local_c88.ptr = (QString *)0x0;
  local_c88.size = 0;
  QList<QString>::reserve((QList<QString> *)&local_c88,*(qsizetype *)((long)__buf + 0x208));
  lVar8 = 0x10;
  for (uVar7 = 0; uVar7 < *(ulong *)((long)__buf + 0x208); uVar7 = uVar7 + 1) {
    lVar2 = *(long *)((long)__buf + 0x200);
    local_c68._0_8_ = *(undefined8 *)(lVar2 + -0x10 + lVar8);
    local_c68.xo_text.d.d = *(Data **)(lVar2 + -8 + lVar8);
    local_c68.xo_text.d.ptr = *(char16_t **)(lVar2 + lVar8);
    if ((Data *)local_c68._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)&((Data *)local_c68._0_8_)->super_QArrayData =
           *(int *)&((Data *)local_c68._0_8_)->super_QArrayData + 1;
      UNLOCK();
    }
    pQVar4 = (QLatin1String *)QtPrivate::lengthHelperPointer<char>("\\\"");
    QtPrivate::lengthHelperPointer<char>("\"");
    QString::replace((QLatin1String *)&local_c68,pQVar4,0x223c68);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_c88,(QString *)&local_c68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c68);
    lVar8 = lVar8 + 0x18;
  }
  attrTagX(&local_c68,"PreprocessorDefinitions",(QStringList *)&local_c88,";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_c68);
  attrTagS(&local_cc0,"PreprocessOutputPath",(QString *)((long)__buf + 0x300));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_cc0);
  attrTagT(&local_cf8,"PreprocessSuppressLineNumbers",*(triState *)((long)__buf + 300));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_cf8);
  if ((ulong)*(uint *)((long)__buf + 0x128) < 3) {
    tVar5 = *(triState *)(&DAT_0021fbb0 + (ulong)*(uint *)((long)__buf + 0x128) * 4);
  }
  else {
    tVar5 = unset;
  }
  attrTagT(&local_d30,"PreprocessToFile",tVar5);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_d30);
  if (((*(int *)(*(long *)((long)__buf + 0x318) + 4) < 0xb0) || (*(int *)((long)__buf + 0xa8) != 0))
     || (*(long *)((long)__buf + 0x220) != 0)) {
    attrTagS(&local_d68,"ProgramDataBaseFileName",(QString *)((long)__buf + 0x210));
  }
  else {
    QString::QString((QString *)&local_da0,"ProgramDataBaseFileName");
    tagValue(&local_d68,(QString *)&local_da0,(QString *)((long)__buf + 0x210));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_da0);
  }
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_d68);
  attrTagS(&local_da0,"ProcessorNumber",(QString *)((long)__buf + 0x2a8));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_da0);
  switch(*(undefined4 *)((long)__buf + 0x228)) {
  case 0:
    pcVar6 = "MultiThreaded";
    break;
  case 1:
    pcVar6 = "MultiThreadedDebug";
    break;
  case 2:
    pcVar6 = "MultiThreadedDLL";
    break;
  case 3:
    pcVar6 = "MultiThreadedDebugDLL";
    break;
  default:
    local_df8.d = (Data *)0x0;
    local_df8.ptr = (char16_t *)0x0;
    local_df8.size = 0;
    goto LAB_001a4e42;
  }
  QString::QString((QString *)&local_df8,pcVar6);
LAB_001a4e42:
  attrTagS(&local_dd8,"RuntimeLibrary",(QString *)&local_df8);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_dd8);
  attrTagT(&local_e30,"RuntimeTypeInfo",*(triState *)((long)__buf + 0x22c));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_e30);
  attrTagT(&local_e68,"ShowIncludes",*(triState *)((long)__buf + 0x230));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_e68);
  attrTagT(&local_ea0,"SmallerTypeCheck",*(triState *)((long)__buf + 0x234));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_ea0);
  attrTagT(&local_ed8,"StringPooling",*(triState *)((long)__buf + 0x238));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_ed8);
  switch(*(undefined4 *)((long)__buf + 0x23c)) {
  case 1:
    pcVar6 = "1Byte";
    break;
  case 2:
    pcVar6 = "2Bytes";
    break;
  case 3:
    pcVar6 = "4Bytes";
    break;
  case 4:
    pcVar6 = "8Bytes";
    break;
  case 5:
    pcVar6 = "16Bytes";
    break;
  default:
    local_f28.d = (Data *)0x0;
    local_f28.ptr = (char16_t *)0x0;
    local_f28.size = 0;
    goto LAB_001a4ff2;
  }
  QString::QString((QString *)&local_f28,pcVar6);
LAB_001a4ff2:
  attrTagS(&local_f10,"StructMemberAlignment",(QString *)&local_f28);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_f10);
  attrTagT(&local_f60,"SuppressStartupBanner",*(triState *)((long)__buf + 0x240));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_f60);
  attrTagX(&local_f98,"TreatSpecificWarningsAsErrors",(QStringList *)((long)__buf + 0x270),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_f98);
  attrTagT(&local_fd0,"TreatWarningAsError",*(triState *)((long)__buf + 0x288));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_fd0);
  attrTagT(&local_1008,"TreatWChar_tAsBuiltInType",*(triState *)((long)__buf + 0x244));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1008);
  attrTagT(&local_1040,"UndefineAllPreprocessorDefinitions",*(triState *)((long)__buf + 0x24c));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1040);
  attrTagX(&local_1078,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x250),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1078);
  attrTagT(&local_10b0,"UseFullPaths",*(triState *)((long)__buf + 0x2a0));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_10b0);
  attrTagT(&local_10e8,"UseUnicodeForAssemblerListing",*(triState *)((long)__buf + 0x26c));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_10e8);
  switch(*(undefined4 *)((long)__buf + 0x28c)) {
  case 0:
    pcVar6 = "TurnOffAllWarnings";
    break;
  case 1:
    pcVar6 = "Level1";
    break;
  case 2:
    pcVar6 = "Level2";
    break;
  case 3:
    pcVar6 = "Level3";
    break;
  case 4:
    pcVar6 = "Level4";
    break;
  default:
    local_1138.d = (Data *)0x0;
    local_1138.ptr = (char16_t *)0x0;
    local_1138.size = 0;
    goto LAB_001a51f4;
  }
  QString::QString((QString *)&local_1138,pcVar6);
LAB_001a51f4:
  attrTagS(&local_1120,"WarningLevel",(QString *)&local_1138);
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1120);
  attrTagT(&local_1170,"WholeProgramOptimization",*(triState *)((long)__buf + 0x290));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1170);
  attrTagS(&local_11a8,"XMLDocumentationFileName",(QString *)((long)__buf + 0x2c8));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_11a8);
  QString::QString((QString *)&local_11f8,"ClCompile");
  closetag(&local_11e0,(QString *)&local_11f8);
  XmlOutput::operator<<(pXVar3,&local_11e0);
  XmlOutput::xml_output::~xml_output(&local_11e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_11f8);
  XmlOutput::xml_output::~xml_output(&local_11a8);
  XmlOutput::xml_output::~xml_output(&local_1170);
  XmlOutput::xml_output::~xml_output(&local_1120);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1138);
  XmlOutput::xml_output::~xml_output(&local_10e8);
  XmlOutput::xml_output::~xml_output(&local_10b0);
  XmlOutput::xml_output::~xml_output(&local_1078);
  XmlOutput::xml_output::~xml_output(&local_1040);
  XmlOutput::xml_output::~xml_output(&local_1008);
  XmlOutput::xml_output::~xml_output(&local_fd0);
  XmlOutput::xml_output::~xml_output(&local_f98);
  XmlOutput::xml_output::~xml_output(&local_f60);
  XmlOutput::xml_output::~xml_output(&local_f10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f28);
  XmlOutput::xml_output::~xml_output(&local_ed8);
  XmlOutput::xml_output::~xml_output(&local_ea0);
  XmlOutput::xml_output::~xml_output(&local_e68);
  XmlOutput::xml_output::~xml_output(&local_e30);
  XmlOutput::xml_output::~xml_output(&local_dd8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_df8);
  XmlOutput::xml_output::~xml_output(&local_da0);
  XmlOutput::xml_output::~xml_output(&local_d68);
  XmlOutput::xml_output::~xml_output(&local_d30);
  XmlOutput::xml_output::~xml_output(&local_cf8);
  XmlOutput::xml_output::~xml_output(&local_cc0);
  XmlOutput::xml_output::~xml_output(&local_c68);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_c88);
  XmlOutput::xml_output::~xml_output(&local_c30);
  XmlOutput::xml_output::~xml_output(&local_bf8);
  XmlOutput::xml_output::~xml_output(&local_bc0);
  XmlOutput::xml_output::~xml_output(&local_b70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b88);
  XmlOutput::xml_output::~xml_output(&local_b18);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b38);
  XmlOutput::xml_output::~xml_output(&local_ae0);
  XmlOutput::xml_output::~xml_output(&local_aa8);
  XmlOutput::xml_output::~xml_output(&local_a70);
  XmlOutput::xml_output::~xml_output(&local_a38);
  XmlOutput::xml_output::~xml_output(&local_a00);
  XmlOutput::xml_output::~xml_output(&local_9c8);
  XmlOutput::xml_output::~xml_output(&local_990);
  XmlOutput::xml_output::~xml_output(&local_958);
  XmlOutput::xml_output::~xml_output(&local_920);
  XmlOutput::xml_output::~xml_output(&local_8d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_8e8);
  XmlOutput::xml_output::~xml_output(&local_898);
  XmlOutput::xml_output::~xml_output(&local_860);
  XmlOutput::xml_output::~xml_output(&local_828);
  XmlOutput::xml_output::~xml_output(&local_7f0);
  XmlOutput::xml_output::~xml_output(&local_7b8);
  XmlOutput::xml_output::~xml_output(&local_780);
  XmlOutput::xml_output::~xml_output(&local_728);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_748);
  XmlOutput::xml_output::~xml_output(&local_6f0);
  XmlOutput::xml_output::~xml_output(&local_698);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_6b8);
  XmlOutput::xml_output::~xml_output(&local_660);
  XmlOutput::xml_output::~xml_output(&local_608);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_628);
  XmlOutput::xml_output::~xml_output(&local_5d0);
  XmlOutput::xml_output::~xml_output(&local_598);
  XmlOutput::xml_output::~xml_output(&local_560);
  XmlOutput::xml_output::~xml_output(&local_510);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_528);
  XmlOutput::xml_output::~xml_output(&local_4d8);
  XmlOutput::xml_output::~xml_output(&local_4a0);
  XmlOutput::xml_output::~xml_output(&local_450);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_468);
  XmlOutput::xml_output::~xml_output(&local_418);
  XmlOutput::xml_output::~xml_output(&local_3e0);
  XmlOutput::xml_output::~xml_output(&local_390);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a8);
  XmlOutput::xml_output::~xml_output(&local_340);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_358);
  XmlOutput::xml_output::~xml_output(&local_2e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
  XmlOutput::xml_output::~xml_output(&local_2b0);
  XmlOutput::xml_output::~xml_output(&local_278);
  XmlOutput::xml_output::~xml_output(&local_240);
  XmlOutput::xml_output::~xml_output(&local_1f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
  XmlOutput::xml_output::~xml_output(&local_1a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
  XmlOutput::xml_output::~xml_output(&local_168);
  XmlOutput::xml_output::~xml_output(&local_130);
  XmlOutput::xml_output::~xml_output(&local_f8);
  XmlOutput::xml_output::~xml_output(&local_c0);
  XmlOutput::xml_output::~xml_output(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCCLCompilerTool &tool)
{
    xml
        << tag(_CLCompile)
            << attrTagX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagX(_AdditionalUsingDirectories, tool.AdditionalUsingDirectories, ";")
            << attrTagS(_AssemblerListingLocation, tool.AssemblerListingLocation)
            << attrTagS(_AssemblerOutput, toString(tool.AssemblerOutput))
            << attrTagS(_BasicRuntimeChecks, toString(tool.BasicRuntimeChecks))
            << attrTagT(_BrowseInformation, toTriState(tool.BrowseInformation))
            << attrTagS(_BrowseInformationFile, tool.BrowseInformationFile)
            << attrTagT(_BufferSecurityCheck, tool.BufferSecurityCheck)
            << attrTagS(_CallingConvention, toString(tool.CallingConvention))
            << attrTagS(_CompileAs, toString(tool.CompileAs))
            << attrTagS(_CompileAsManaged, toString(tool.CompileAsManaged))
            << attrTagT(_CompileAsWinRT, tool.CompileAsWinRT)
            << attrTagT(_CreateHotpatchableImage, tool.CreateHotpatchableImage)
            << attrTagS(_DebugInformationFormat, toString(tool.DebugInformationFormat,
                                                          tool.config->CompilerVersion))
            << attrTagT(_DisableLanguageExtensions, tool.DisableLanguageExtensions)
            << attrTagX(_DisableSpecificWarnings, tool.DisableSpecificWarnings, ";")
            << attrTagS(_EnableEnhancedInstructionSet, toString(tool.EnableEnhancedInstructionSet))
            << attrTagT(_EnableFiberSafeOptimizations, tool.EnableFiberSafeOptimizations)
            << attrTagT(_EnablePREfast, tool.EnablePREfast)
            << attrTagS(_ErrorReporting, tool.ErrorReporting)
            << attrTagS(_ExceptionHandling, toString(tool.ExceptionHandling))
            << attrTagT(_ExpandAttributedSource, tool.ExpandAttributedSource)
            << attrTagS(_FavorSizeOrSpeed, toString(tool.FavorSizeOrSpeed))
            << attrTagT(_FloatingPointExceptions, tool.FloatingPointExceptions)
            << attrTagS(_FloatingPointModel, toString(tool.FloatingPointModel))
            << attrTagT(_ForceConformanceInForLoopScope, tool.ForceConformanceInForLoopScope)
            << attrTagX(_ForcedIncludeFiles, tool.ForcedIncludeFiles, ";")
            << attrTagX(_ForcedUsingFiles, tool.ForcedUsingFiles, ";")
            << attrTagT(_FunctionLevelLinking, tool.EnableFunctionLevelLinking)
            << attrTagT(_GenerateXMLDocumentationFiles, tool.GenerateXMLDocumentationFiles)
            << attrTagT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
            << attrTagS(_InlineFunctionExpansion, toString(tool.InlineFunctionExpansion))
            << attrTagT(_IntrinsicFunctions, tool.EnableIntrinsicFunctions)
            << attrTagT(_MinimalRebuild, tool.MinimalRebuild)
            << attrTagT(_MultiProcessorCompilation, tool.MultiProcessorCompilation)
            << attrTagS(_LanguageStandard, tool.LanguageStandard)
            << attrTagS(_LanguageStandard_C, tool.LanguageStandard_C)
            << attrTagS(_ObjectFileName, tool.ObjectFile)
            << attrTagT(_OmitDefaultLibName, tool.OmitDefaultLibName)
            << attrTagT(_OmitFramePointers, tool.OmitFramePointers)
            << attrTagT(_OpenMPSupport, tool.OpenMP)
            << attrTagS(_Optimization, toString(tool.Optimization))
            << attrTagS(_PrecompiledHeader, toString(tool.UsePrecompiledHeader))
            << attrTagS(_PrecompiledHeaderFile, tool.PrecompiledHeaderThrough)
            << attrTagS(_PrecompiledHeaderOutputFile, tool.PrecompiledHeaderFile)
            << attrTagT(_PreprocessKeepComments, tool.KeepComments)
            << attrTagX(_PreprocessorDefinitions, unquote(tool.PreprocessorDefinitions), ";")
            << attrTagS(_PreprocessOutputPath, tool.PreprocessOutputPath)
            << attrTagT(_PreprocessSuppressLineNumbers, tool.PreprocessSuppressLineNumbers)
            << attrTagT(_PreprocessToFile, toTriState(tool.GeneratePreprocessedFile))
            << fixedProgramDataBaseFileNameOutput(tool)
            << attrTagS(_ProcessorNumber, tool.MultiProcessorCompilationProcessorCount)
            << attrTagS(_RuntimeLibrary, toString(tool.RuntimeLibrary))
            << attrTagT(_RuntimeTypeInfo, tool.RuntimeTypeInfo)
            << attrTagT(_ShowIncludes, tool.ShowIncludes)
            << attrTagT(_SmallerTypeCheck, tool.SmallerTypeCheck)
            << attrTagT(_StringPooling, tool.StringPooling)
            << attrTagS(_StructMemberAlignment, toString(tool.StructMemberAlignment))
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
            << attrTagX(_TreatSpecificWarningsAsErrors, tool.TreatSpecificWarningsAsErrors, ";")
            << attrTagT(_TreatWarningAsError, tool.WarnAsError)
            << attrTagT(_TreatWChar_tAsBuiltInType, tool.TreatWChar_tAsBuiltInType)
            << attrTagT(_UndefineAllPreprocessorDefinitions, tool.UndefineAllPreprocessorDefinitions)
            << attrTagX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions, ";")
            << attrTagT(_UseFullPaths, tool.DisplayFullPaths)
            << attrTagT(_UseUnicodeForAssemblerListing, tool.UseUnicodeForAssemblerListing)
            << attrTagS(_WarningLevel, toString(tool.WarningLevel))
            << attrTagT(_WholeProgramOptimization, tool.WholeProgramOptimization)
            << attrTagS(_XMLDocumentationFileName, tool.XMLDocumentationFileName)
        << closetag(_CLCompile);
}